

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::RelationBinder::BindExpression
          (BindResult *__return_storage_ptr__,RelationBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  pointer pcVar2;
  type expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  BinderException BStack_58;
  string local_48;
  
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(expr_ptr);
  EVar1 = (expr->super_BaseExpression).expression_class;
  if (EVar1 < SUBQUERY) {
    if (EVar1 != AGGREGATE) {
      if (EVar1 != DEFAULT) {
LAB_0071f2ad:
        ExpressionBinder::BindExpression
                  (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
        return __return_storage_ptr__;
      }
      pcVar2 = (this->op)._M_dataplus._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + (this->op)._M_string_length);
      ::std::__cxx11::string::append((char *)&local_48);
      BinderException::Unsupported(&BStack_58,expr,&local_48);
      BindResult::BindResult(__return_storage_ptr__,&BStack_58.super_Exception);
      ::std::runtime_error::~runtime_error((runtime_error *)&BStack_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0071f346;
    }
    ::std::operator+(&local_48,"aggregate functions are not allowed in ",&this->op);
    BinderException::Unsupported(&BStack_58,expr,&local_48);
    BindResult::BindResult(__return_storage_ptr__,&BStack_58.super_Exception);
  }
  else if (EVar1 == SUBQUERY) {
    ::std::operator+(&local_48,"subqueries are not allowed in ",&this->op);
    BinderException::Unsupported(&BStack_58,expr,&local_48);
    BindResult::BindResult(__return_storage_ptr__,&BStack_58.super_Exception);
  }
  else {
    if (EVar1 != WINDOW) goto LAB_0071f2ad;
    ::std::operator+(&local_48,"window functions are not allowed in ",&this->op);
    BinderException::Unsupported(&BStack_58,expr,&local_48);
    BindResult::BindResult(__return_storage_ptr__,&BStack_58.super_Exception);
  }
  ::std::runtime_error::~runtime_error((runtime_error *)&BStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    return __return_storage_ptr__;
  }
LAB_0071f346:
  operator_delete(local_48._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

BindResult RelationBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::AGGREGATE:
		return BindResult(BinderException::Unsupported(expr, "aggregate functions are not allowed in " + op));
	case ExpressionClass::DEFAULT:
		return BindResult(BinderException::Unsupported(expr, op + " cannot contain DEFAULT clause"));
	case ExpressionClass::SUBQUERY:
		return BindResult(BinderException::Unsupported(expr, "subqueries are not allowed in " + op));
	case ExpressionClass::WINDOW:
		return BindResult(BinderException::Unsupported(expr, "window functions are not allowed in " + op));
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}